

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_global.c
# Opt level: O1

TA_RetCode TA_RestoreCandleDefaultSettings(TA_CandleSettingType settingType)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  TA_RetCode TVar4;
  ulong uVar5;
  TA_CandleSetting *pTVar6;
  
  TVar4 = TA_BAD_PARAM;
  if (settingType < (TA_Near|TA_ShadowLong)) {
    pTVar6 = TA_Globals->candleSettings;
    if (settingType == TA_AllCandleSettings) {
      memcpy(pTVar6,&DAT_001b6140,0x108);
      return TA_SUCCESS;
    }
    uVar5 = (ulong)settingType;
    lVar1 = uVar5 * 0x18;
    TA_Globals->candleSettings[uVar5].factor = *(double *)(&DAT_001b6150 + lVar1);
    uVar2 = *(undefined8 *)(&DAT_001b6140 + lVar1);
    uVar3 = *(undefined8 *)(&UNK_001b6148 + lVar1);
    pTVar6 = pTVar6 + uVar5;
    pTVar6->settingType = (int)uVar2;
    pTVar6->rangeType = (int)((ulong)uVar2 >> 0x20);
    *(undefined8 *)&pTVar6->avgPeriod = uVar3;
    TVar4 = TA_SUCCESS;
  }
  return TVar4;
}

Assistant:

TA_RetCode TA_RestoreCandleDefaultSettings( TA_CandleSettingType settingType )
{
    const TA_CandleSetting TA_CandleDefaultSettings[] = {
        /* real body is long when it's longer than the average of the 10 previous candles' real body */
        { TA_BodyLong, TA_RangeType_RealBody, 10, 1.0 },
        /* real body is very long when it's longer than 3 times the average of the 10 previous candles' real body */
        { TA_BodyVeryLong, TA_RangeType_RealBody, 10, 3.0 },
        /* real body is short when it's shorter than the average of the 10 previous candles' real bodies */
        { TA_BodyShort, TA_RangeType_RealBody, 10, 1.0 },
        /* real body is like doji's body when it's shorter than 10% the average of the 10 previous candles' high-low range */
        { TA_BodyDoji, TA_RangeType_HighLow, 10, 0.1 },
        /* shadow is long when it's longer than the real body */
        { TA_ShadowLong, TA_RangeType_RealBody, 0, 1.0 },
        /* shadow is very long when it's longer than 2 times the real body */
        { TA_ShadowVeryLong, TA_RangeType_RealBody, 0, 2.0 },
        /* shadow is short when it's shorter than half the average of the 10 previous candles' sum of shadows */
        { TA_ShadowShort, TA_RangeType_Shadows, 10, 1.0 },
        /* shadow is very short when it's shorter than 10% the average of the 10 previous candles' high-low range */
        { TA_ShadowVeryShort, TA_RangeType_HighLow, 10, 0.1 },
        /* when measuring distance between parts of candles or width of gaps */
        /* "near" means "<= 20% of the average of the 5 previous candles' high-low range" */
        { TA_Near, TA_RangeType_HighLow, 5, 0.2 },
        /* when measuring distance between parts of candles or width of gaps */
        /* "far" means ">= 60% of the average of the 5 previous candles' high-low range" */
        { TA_Far, TA_RangeType_HighLow, 5, 0.6 },
        /* when measuring distance between parts of candles or width of gaps */
        /* "equal" means "<= 5% of the average of the 5 previous candles' high-low range" */
        { TA_Equal, TA_RangeType_HighLow, 5, 0.05 }
    };

    int i;
    if( settingType > TA_AllCandleSettings )
        return TA_BAD_PARAM;
    if( settingType == TA_AllCandleSettings )
        for( i = 0; i < TA_AllCandleSettings; ++i )
            TA_Globals->candleSettings[i] = TA_CandleDefaultSettings[i];
    else
        TA_Globals->candleSettings[settingType] = TA_CandleDefaultSettings[settingType];
    return TA_SUCCESS;
}